

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeNext_NOT(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  Fts5ExprNode *in_RDI;
  int rc;
  Fts5Expr *unaff_retaddr;
  undefined4 local_24;
  
  local_24 = (**(code **)(*(long *)(in_RSI + 0x30) + 0x10))
                       (in_RDI,*(undefined8 *)(in_RSI + 0x30),in_EDX,in_RCX);
  if (local_24 == 0) {
    local_24 = fts5ExprNodeTest_NOT(unaff_retaddr,in_RDI);
  }
  if (local_24 != 0) {
    *(undefined4 *)(in_RSI + 8) = 0;
  }
  return local_24;
}

Assistant:

static int fts5ExprNodeNext_NOT(
  Fts5Expr *pExpr,
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int rc = fts5ExprNodeNext(pExpr, pNode->apChild[0], bFromValid, iFrom);
  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest_NOT(pExpr, pNode);
  }
  if( rc!=SQLITE_OK ){
    pNode->bNomatch = 0;
  }
  return rc;
}